

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSetupScrollFreeze(int columns,int rows)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  char cVar3;
  char cVar4;
  ImGuiTable *pIVar5;
  char *pcVar6;
  ImGuiTableColumn *pIVar7;
  int column_n;
  ulong uVar8;
  ImGuiTableColumnIdx IVar9;
  uint uVar10;
  ImGuiTableColumnIdx IVar11;
  ImGuiTableColumnIdx IVar12;
  
  IVar11 = (ImGuiTableColumnIdx)rows;
  pIVar5 = GImGui->CurrentTable;
  uVar8 = 0;
  uVar10 = 0;
  if (((uint)pIVar5->Flags >> 0x18 & 1) != 0) {
    uVar10 = pIVar5->ColumnsCount;
    if (columns < pIVar5->ColumnsCount) {
      uVar10 = columns;
    }
  }
  IVar9 = (ImGuiTableColumnIdx)uVar10;
  pIVar5->FreezeColumnsRequest = IVar9;
  pIVar1 = &pIVar5->InnerWindow->Scroll;
  IVar12 = '\0';
  if (pIVar1->x != 0.0) {
    IVar12 = IVar9;
  }
  if (NAN(pIVar1->x)) {
    IVar12 = IVar9;
  }
  pIVar5->FreezeColumnsCount = IVar12;
  if (((uint)pIVar5->Flags >> 0x19 & 1) == 0) {
    IVar11 = '\0';
  }
  pIVar5->FreezeRowsRequest = IVar11;
  pfVar2 = &(pIVar5->InnerWindow->Scroll).y;
  IVar12 = '\0';
  if (*pfVar2 != 0.0) {
    IVar12 = IVar11;
  }
  if (NAN(*pfVar2)) {
    IVar12 = IVar11;
  }
  pIVar5->FreezeRowsCount = IVar12;
  pIVar5->IsUnfrozenRows = IVar12 == '\0';
  for (; (long)uVar8 < (long)(char)uVar10; uVar8 = uVar8 + 1) {
    pcVar6 = (pIVar5->DisplayOrderToIndex).Data;
    cVar3 = pcVar6[uVar8];
    if ((char)uVar10 <= cVar3 && uVar8 != (uint)(int)cVar3) {
      cVar4 = pcVar6[cVar3];
      pIVar7 = (pIVar5->Columns).Data;
      IVar11 = pIVar7[cVar4].DisplayOrder;
      pIVar7[cVar4].DisplayOrder = pIVar7[cVar3].DisplayOrder;
      pIVar7[cVar3].DisplayOrder = IVar11;
      pcVar6 = (pIVar5->DisplayOrderToIndex).Data;
      cVar4 = pcVar6[cVar3];
      pcVar6[cVar3] = pcVar6[uVar8];
      pcVar6[uVar8] = cVar4;
      uVar10 = (uint)(byte)pIVar5->FreezeColumnsRequest;
    }
  }
  return;
}

Assistant:

void ImGui::TableSetupScrollFreeze(int columns, int rows)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(table->IsLayoutLocked == false && "Need to call TableSetupColumn() before first row!");
    IM_ASSERT(columns >= 0 && columns < IMGUI_TABLE_MAX_COLUMNS);
    IM_ASSERT(rows >= 0 && rows < 128); // Arbitrary limit

    table->FreezeColumnsRequest = (table->Flags & ImGuiTableFlags_ScrollX) ? (ImGuiTableColumnIdx)ImMin(columns, table->ColumnsCount) : 0;
    table->FreezeColumnsCount = (table->InnerWindow->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->FreezeRowsRequest = (table->Flags & ImGuiTableFlags_ScrollY) ? (ImGuiTableColumnIdx)rows : 0;
    table->FreezeRowsCount = (table->InnerWindow->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->IsUnfrozenRows = (table->FreezeRowsCount == 0); // Make sure this is set before TableUpdateLayout() so ImGuiListClipper can benefit from it.b

    // Ensure frozen columns are ordered in their section. We still allow multiple frozen columns to be reordered.
    // FIXME-TABLE: This work for preserving 2143 into 21|43. How about 4321 turning into 21|43? (preserve relative order in each section)
    for (int column_n = 0; column_n < table->FreezeColumnsRequest; column_n++)
    {
        int order_n = table->DisplayOrderToIndex[column_n];
        if (order_n != column_n && order_n >= table->FreezeColumnsRequest)
        {
            ImSwap(table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder, table->Columns[table->DisplayOrderToIndex[column_n]].DisplayOrder);
            ImSwap(table->DisplayOrderToIndex[order_n], table->DisplayOrderToIndex[column_n]);
        }
    }
}